

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

ON_3dPoint * __thiscall
ON_SubDMeshFragment::VertexPoint
          (ON_3dPoint *__return_storage_ptr__,ON_SubDMeshFragment *this,uint grid_point_index)

{
  double dVar1;
  
  if (((this->m_P == (double *)0x0) || (this->m_P_stride < 3)) ||
     ((this->m_vertex_count_etc & 0x1fff) <= grid_point_index)) {
    __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
    dVar1 = ON_3dPoint::NanPoint.y;
    __return_storage_ptr__->x = ON_3dPoint::NanPoint.x;
    __return_storage_ptr__->y = dVar1;
  }
  else {
    ON_3dPoint::ON_3dPoint
              (__return_storage_ptr__,this->m_P + this->m_P_stride * (ulong)grid_point_index);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_3dPoint ON_SubDMeshFragment::VertexPoint(
  unsigned grid_point_index
) const
{
  if (grid_point_index >= (unsigned)PointCount())
    return ON_3dPoint::NanPoint;
  return ON_3dPoint(m_P + grid_point_index * m_P_stride);
}